

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inipp.h
# Opt level: O0

bool inipp::detail::replace<wchar_t>
               (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *str,
               basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *from,
               basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *to)

{
  ulong uVar1;
  wstring *pwVar2;
  size_t start_pos;
  bool changed;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *to_local;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *from_local;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *str_local;
  
  start_pos._7_1_ = false;
  while( true ) {
    uVar1 = std::__cxx11::wstring::find((wstring *)str,(ulong)from);
    if (uVar1 == 0xffffffffffffffff) break;
    pwVar2 = (wstring *)std::__cxx11::wstring::length();
    std::__cxx11::wstring::replace((ulong)str,uVar1,pwVar2);
    std::__cxx11::wstring::length();
    start_pos._7_1_ = true;
  }
  return start_pos._7_1_;
}

Assistant:

inline bool replace(std::basic_string<CharT> & str, const std::basic_string<CharT> & from, const std::basic_string<CharT> & to) {
	auto changed = false;
	size_t start_pos = 0;
	while ((start_pos = str.find(from, start_pos)) != std::basic_string<CharT>::npos) {
		str.replace(start_pos, from.length(), to);
		start_pos += to.length();
		changed = true;
	}
	return changed;
}